

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmStateSnapshot *rootSnp,cmStateSnapshot *snp_)

{
  bool bVar1;
  cmStateSnapshot snp;
  string local_98;
  cmStateSnapshot local_78;
  cmStateDirectory local_58;
  
  local_78.Position.Position = (snp_->Position).Position;
  local_78.State = snp_->State;
  local_78.Position.Tree = (snp_->Position).Tree;
  bVar1 = cmStateSnapshot::IsValid(&local_78);
  if (bVar1) {
    do {
      bVar1 = ::operator==(&local_78,rootSnp);
      if (bVar1) {
        return false;
      }
      cmStateSnapshot::GetDirectory(&local_58,&local_78);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"EXCLUDE_FROM_ALL","");
      bVar1 = cmStateDirectory::GetPropertyAsBool(&local_58,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        return true;
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_58,&local_78);
      local_78.Position.Position = (PositionType)local_58.Snapshot_.State;
      local_78.State = (cmState *)local_58.DirectoryState.Tree;
      local_78.Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_58.DirectoryState.Position;
      bVar1 = cmStateSnapshot::IsValid(&local_78);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmStateSnapshot const& rootSnp,
                                   cmStateSnapshot const& snp_) const
{
  cmStateSnapshot snp = snp_;
  while (snp.IsValid()) {
    if (snp == rootSnp) {
      // No directory excludes itself.
      return false;
    }

    if (snp.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
      // This directory is excluded from its parent.
      return true;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return false;
}